

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall wallet::coinselector_tests::SelectCoins_test::test_method(SelectCoins_test *this)

{
  long lVar1;
  int iVar2;
  T *this_00;
  int iVar3;
  CAmount *nTargetValue;
  iterator pvVar4;
  CCoinControl *pCVar5;
  iterator pvVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  result_type_conflict1 rVar9;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar10;
  int in_stack_fffffffffffffb58;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  _Base_ptr local_450;
  assertion_result local_448;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  CAmount target;
  exponential_distribution<double> distribution;
  default_random_engine generator;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  undefined1 local_3f0 [16];
  SignalInterrupt *local_3e0;
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> local_3d8;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_3d0;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> _Stack_3c8;
  __uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> _Stack_3c0;
  undefined7 uStack_3b8;
  undefined1 local_3b1;
  undefined7 uStack_3b0;
  undefined8 uStack_3a9;
  __uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> local_3a0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  undefined1 local_388 [8];
  __uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_> _Stack_380
  ;
  __uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_> local_378;
  _Base_ptr local_370;
  _Base_ptr local_368;
  pointer local_360;
  __uniq_ptr_impl<interfaces::Mining,_std::default_delete<interfaces::Mining>_> _Stack_358;
  Result<wallet::SelectionResult> result;
  CCoinControl cc;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&cc,"",(allocator<char> *)&rand);
  NewWallet((NodeContext *)&wallet,
            (string *)
            &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node);
  std::__cxx11::string::~string((string *)&cc);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock15,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((long)wallet._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8),
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             ,0x33a,false);
  generator._M_x = 1;
  distribution._M_param._M_lambda = (param_type)100.0;
  FastRandomContext::FastRandomContext(&rand,false);
  for (iVar2 = 0; iVar2 != 100; iVar2 = iVar2 + 1) {
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
    available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = 0;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    available_coins.total_amount = 0;
    available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = true;
    iVar3 = 1000;
    lVar7 = 0;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
      rVar9 = std::exponential_distribution<double>::operator()(&distribution,&generator);
      cc.destChange.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_8_ = (long)(rVar9 * 10000000.0);
      add_coin(&available_coins,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&cc,
               (CFeeRate)0x0,0x90,false,0,false,in_stack_fffffffffffffb58);
      lVar7 = lVar7 + (long)(rVar9 * 10000000.0);
    }
    RandomMixin<FastRandomContext>::randrange<int>(&rand.super_RandomMixin<FastRandomContext>,300);
    lVar7 = RandomMixin<FastRandomContext>::randrange<long>
                      (&rand.super_RandomMixin<FastRandomContext>,lVar7 + -1000);
    target = lVar7 + 1000;
    local_3f0._8_8_ = (Init *)0x9400000022;
    local_3e0 = (SignalInterrupt *)0xf4240;
    local_3a0._M_t.super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
         (tuple<BanMan_*,_std::default_delete<BanMan>_>)
         (_Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>)0x0;
    uStack_3b0 = 0;
    uStack_3a9 = 0;
    _Stack_3c0._M_t.
    super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
    super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
         (tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)
         (_Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)0x0
    ;
    uStack_3b8 = 0;
    local_3b1 = 0;
    local_3d0._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (tuple<CConnman_*,_std::default_delete<CConnman>_>)
         (_Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>)0x0;
    _Stack_3c8._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
         (_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>)0x1;
    local_3d8._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
         (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
         (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x1;
    local_3f0._0_8_ = &rand;
    CCoinControl::CCoinControl(&cc);
    local_378._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
         (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
         (_Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)0x0;
    local_388 = (undefined1  [8])0x0;
    _Stack_380._M_t.
    super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
    .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl =
         (tuple<interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>)
         (_Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
         )0x0;
    local_370 = (_Base_ptr)&_Stack_380;
    local_360 = (pointer)0x0;
    _Stack_358._M_t.
    super__Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>.
    super__Head_base<0UL,_interfaces::Mining_*,_false>._M_head_impl =
         (tuple<interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>)
         (_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>)0x0;
    nTargetValue = &target;
    pCVar5 = &cc;
    local_368 = local_370;
    SelectCoins(&result,(CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                &available_coins,(PreSelectedInputs *)local_388,nTargetValue,&cc,
                (CoinSelectionParams *)local_3f0);
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)local_388);
    local_420 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_418 = "";
    local_430 = &boost::unit_test::basic_cstring<char_const>::null;
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar10 = 0x62177a;
    msg.m_end = (iterator)pCVar5;
    msg.m_begin = (iterator)nTargetValue;
    file.m_end = (iterator)0x365;
    file.m_begin = (iterator)&local_420;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_430,msg);
    local_448.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index == '\x01');
    local_448.m_message.px = (element_type *)0x0;
    local_448.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_458 = "result";
    local_450 = (_Base_ptr)0xcbb941;
    _Stack_380._M_t.
    super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
    .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl =
         (tuple<interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>)
         ((ulong)_Stack_380._M_t.
                 super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
                 .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl &
         0xffffffffffffff00);
    local_388 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
    local_378._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
         (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
         boost::unit_test::lazy_ostream::inst;
    local_370 = (_Base_ptr)&local_458;
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_460 = "";
    pvVar4 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_448,(lazy_ostream *)local_388,1,0,WARN,_cVar10,(size_t)&local_468,0x365);
    boost::detail::shared_count::~shared_count(&local_448.m_message.pn);
    local_478 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_470 = "";
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar4;
    file_00.m_end = (iterator)0x366;
    file_00.m_begin = (iterator)&local_478;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_488,
               msg_00);
    _Stack_380._M_t.
    super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
    .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl =
         (tuple<interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>)
         ((ulong)_Stack_380._M_t.
                 super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
                 .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl &
         0xffffffffffffff00);
    local_388 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
    local_378._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
         (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
         boost::unit_test::lazy_ostream::inst;
    local_370 = (_Base_ptr)0xc694e1;
    local_498 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_490 = "";
    this_00 = util::Result<wallet::SelectionResult>::value(&result);
    local_448._0_8_ = SelectionResult::GetSelectedValue(this_00);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,long,long>
              (local_388,&local_498,0x366,1,7,&local_448,"result->GetSelectedValue()",&target,
               "target");
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
    CCoinControl::~CCoinControl(&cc);
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)&available_coins);
  }
  ChaCha20::~ChaCha20(&rand.rng);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock15.super_unique_lock);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_test)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    LOCK(wallet->cs_wallet); // Every 'SelectCoins' call requires it

    // Random generator stuff
    std::default_random_engine generator;
    std::exponential_distribution<double> distribution (100);
    FastRandomContext rand;

    // Run this test 100 times
    for (int i = 0; i < 100; ++i)
    {
        CoinsResult available_coins;
        CAmount balance{0};

        // Make a wallet with 1000 exponentially distributed random inputs
        for (int j = 0; j < 1000; ++j)
        {
            CAmount val = distribution(generator)*10000000;
            add_coin(available_coins, *wallet, val);
            balance += val;
        }

        // Generate a random fee rate in the range of 100 - 400
        CFeeRate rate(rand.randrange(300) + 100);

        // Generate a random target value between 1000 and wallet balance
        CAmount target = rand.randrange(balance - 1000) + 1000;

        // Perform selection
        CoinSelectionParams cs_params{
            rand,
            /*change_output_size=*/ 34,
            /*change_spend_size=*/ 148,
            /*min_change_target=*/ CENT,
            /*effective_feerate=*/ CFeeRate(0),
            /*long_term_feerate=*/ CFeeRate(0),
            /*discard_feerate=*/ CFeeRate(0),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ false,
        };
        cs_params.m_cost_of_change = 1;
        cs_params.min_viable_change = 1;
        CCoinControl cc;
        const auto result = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, target, cc, cs_params);
        BOOST_CHECK(result);
        BOOST_CHECK_GE(result->GetSelectedValue(), target);
    }
}